

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_LdHomeObj(Var scriptFunction,ScriptContext *scriptContext)

{
  bool bVar1;
  int iVar2;
  ThreadContext *threadContext;
  JavascriptLibrary *pJVar3;
  ScriptFunction *pSVar4;
  undefined4 extraout_var;
  RecyclableObject *local_90;
  Var homeObj;
  ScriptFunction *instance;
  undefined1 local_40 [8];
  JsReentLock reentrancylock;
  ScriptContext *scriptContext_local;
  Var scriptFunction_local;
  
  reentrancylock._24_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_40,threadContext);
  bVar1 = VarIs<Js::ScriptFunction>(scriptFunction);
  if ((!bVar1) || (bVar1 = ThreadContext::IsOnStack(scriptFunction), bVar1)) {
    pJVar3 = ScriptContext::GetLibrary((ScriptContext *)reentrancylock._24_8_);
    scriptFunction_local = JavascriptLibraryBase::GetUndefined(&pJVar3->super_JavascriptLibraryBase)
    ;
  }
  else {
    pSVar4 = UnsafeVarTo<Js::ScriptFunction>(scriptFunction);
    iVar2 = (*(pSVar4->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x73])();
    local_90 = (RecyclableObject *)CONCAT44(extraout_var,iVar2);
    if (local_90 == (RecyclableObject *)0x0) {
      pJVar3 = ScriptContext::GetLibrary((ScriptContext *)reentrancylock._24_8_);
      local_90 = JavascriptLibraryBase::GetUndefined(&pJVar3->super_JavascriptLibraryBase);
    }
    scriptFunction_local = local_90;
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_40);
  return scriptFunction_local;
}

Assistant:

Var JavascriptOperators::OP_LdHomeObj(Var scriptFunction, ScriptContext * scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(LdHomeObj, reentrancylock, scriptContext->GetThreadContext());
        // Ensure this is not a stack ScriptFunction
        if (!VarIs<ScriptFunction>(scriptFunction) || ThreadContext::IsOnStack(scriptFunction))
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }

        ScriptFunction *instance = UnsafeVarTo<ScriptFunction>(scriptFunction);

        // We keep a reference to the current class rather than its super prototype
        // since the prototype could change.
        Var homeObj = instance->GetHomeObj();

        return (homeObj != nullptr) ? homeObj : scriptContext->GetLibrary()->GetUndefined();
        JIT_HELPER_END(LdHomeObj);
    }